

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Classifier __thiscall CLI::App::_recognize(App *this,string *current,bool ignore_used_subcommands)

{
  bool bVar1;
  Option *pOVar2;
  Classifier CVar3;
  string dummy1;
  string dummy2;
  string local_38;
  
  dummy1._M_dataplus._M_p = (pointer)&dummy1.field_2;
  dummy1._M_string_length = 0;
  dummy1.field_2._M_local_buf[0] = '\0';
  dummy2._M_dataplus._M_p = (pointer)&dummy2.field_2;
  dummy2._M_string_length = 0;
  dummy2.field_2._M_local_buf[0] = '\0';
  bVar1 = ::std::operator==(current,"--");
  if (bVar1) {
    CVar3 = POSITIONAL_MARK;
    goto LAB_0011ba2d;
  }
  bVar1 = _valid_subcommand(this,current,ignore_used_subcommands);
  if (bVar1) {
    CVar3 = SUBCOMMAND;
    goto LAB_0011ba2d;
  }
  bVar1 = detail::split_long(current,&dummy1,&dummy2);
  if (bVar1) {
    CVar3 = LONG;
    goto LAB_0011ba2d;
  }
  bVar1 = detail::split_short(current,&dummy1,&dummy2);
  if (bVar1) {
    if ((byte)(*dummy1._M_dataplus._M_p - 0x30U) < 10) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      local_38.field_2._M_allocated_capacity._0_2_ =
           (ushort)(byte)*dummy1._M_dataplus._M_p << 8 | 0x2d;
      local_38._M_string_length = 2;
      local_38.field_2._M_local_buf[2] = '\0';
      pOVar2 = get_option_no_throw(this,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
      if (pOVar2 == (Option *)0x0) goto LAB_0011ba4a;
    }
    CVar3 = SHORT;
  }
  else {
    if ((this->allow_windows_style_options_ == true) &&
       (bVar1 = detail::split_windows_style(current,&dummy1,&dummy2), bVar1)) {
      CVar3 = WINDOWS;
      goto LAB_0011ba2d;
    }
    bVar1 = ::std::operator==(current,"++");
    if (((bVar1) && ((this->name_)._M_string_length != 0)) && (this->parent_ != (App *)0x0)) {
      CVar3 = SUBCOMMAND_TERMINATOR;
      goto LAB_0011ba2d;
    }
LAB_0011ba4a:
    CVar3 = NONE;
  }
LAB_0011ba2d:
  ::std::__cxx11::string::~string((string *)&dummy2);
  ::std::__cxx11::string::~string((string *)&dummy1);
  return CVar3;
}

Assistant:

detail::Classifier _recognize(const std::string &current, bool ignore_used_subcommands = true) const {
        std::string dummy1, dummy2;

        if(current == "--")
            return detail::Classifier::POSITIONAL_MARK;
        if(_valid_subcommand(current, ignore_used_subcommands))
            return detail::Classifier::SUBCOMMAND;
        if(detail::split_long(current, dummy1, dummy2))
            return detail::Classifier::LONG;
        if(detail::split_short(current, dummy1, dummy2)) {
            if(dummy1[0] >= '0' && dummy1[0] <= '9') {
                if(get_option_no_throw(std::string{'-', dummy1[0]}) == nullptr) {
                    return detail::Classifier::NONE;
                }
            }
            return detail::Classifier::SHORT;
        }
        if((allow_windows_style_options_) && (detail::split_windows_style(current, dummy1, dummy2)))
            return detail::Classifier::WINDOWS;
        if((current == "++") && !name_.empty() && parent_ != nullptr)
            return detail::Classifier::SUBCOMMAND_TERMINATOR;
        return detail::Classifier::NONE;
    }